

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

LY_ERR lyjson_next_array_item(lyjson_ctx *jsonctx)

{
  char cVar1;
  ly_ctx *ctx;
  uint uVar2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyjson_ctx *jsonctx_local;
  
  cVar1 = *jsonctx->in->current;
  if (cVar1 == '\0') {
    ly_vlog(jsonctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
    jsonctx_local._4_4_ = LY_EVALID;
  }
  else {
    if (cVar1 == ',') {
      ly_in_skip(jsonctx->in,1);
      jsonctx_local._4_4_ = ly_set_add(&jsonctx->status,(void *)0x5,'\x01',(uint32_t *)0x0);
    }
    else {
      if (cVar1 != ']') {
        ctx = jsonctx->ctx;
        uVar2 = LY_VCODE_INSTREXP_len(jsonctx->in->current);
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                (ulong)uVar2,jsonctx->in->current,"a JSON array-end or next item");
        return LY_EVALID;
      }
      ly_in_skip(jsonctx->in,1);
      jsonctx_local._4_4_ = ly_set_add(&jsonctx->status,(void *)0x6,'\x01',(uint32_t *)0x0);
    }
    if (jsonctx_local._4_4_ == LY_SUCCESS) {
      jsonctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return jsonctx_local._4_4_;
}

Assistant:

static LY_ERR
lyjson_next_array_item(struct lyjson_ctx *jsonctx)
{
    switch (*jsonctx->in->current) {
    case '\0':
        /* EOF */
        LOGVAL(jsonctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;

    case ']':
        /* array end */
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_ARRAY_CLOSED);
        break;

    case ',':
        /* next array item */
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_ARRAY_NEXT);
        break;

    default:
        /* unexpected value */
        LOGVAL(jsonctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(jsonctx->in->current),
                jsonctx->in->current, "a JSON array-end or next item");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}